

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall Socket_TCP_Test::TestBody(Socket_TCP_Test *this)

{
  int handle;
  Socket socket;
  
  handle = socketsys::UnixProvider::init((UnixProvider *)0x0,(EVP_PKEY_CTX *)0x0);
  socket.m_Handle = handle;
  socketsys::UnixProvider::setTcpNoDelay(handle,true);
  socketsys::UnixProvider::setSoReuseAddress(handle,false);
  socketsys::UnixProvider::setSoLinger(socket.m_Handle,false,0);
  socketsys::UnixProvider::setSoReceiveTimeout(socket.m_Handle,100);
  socketsys::UnixProvider::setSoSendTimeout(socket.m_Handle,100);
  socketsys::UnixProvider::setSoSendBufferSize(socket.m_Handle,100);
  socketsys::UnixProvider::setSoReceiveBufferSize(socket.m_Handle,100);
  socketsys::UnixProvider::setSoKeepAlive(socket.m_Handle,true);
  socketsys::SocketInterface<socketsys::UnixProvider>::~SocketInterface(&socket);
  return;
}

Assistant:

TEST(Socket, TCP) {
    Socket socket(AddressFamily::IPV4, SocketProtocol::TCP);
    socket.setTcpNoDelay(true);
    socket.setSoReuseAddress(false);
    socket.setSoLinger(false, 0);
    socket.setSoReceiveTimeout(100);
    socket.setSoSendTimeout(100);
    socket.setSoSendBufferSize(100);
    socket.setSoReceiveBufferSize(100);
    socket.setSoKeepAlive(true);
}